

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O3

void combine_chr(double *p_value_g,int m,int num_chr,int *m_chr,double **NM)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  void *pvVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar18;
  double dVar19;
  undefined1 auVar20 [16];
  int iVar21;
  undefined1 auVar22 [16];
  double local_78;
  undefined1 local_58 [16];
  long lVar17;
  
  uVar8 = (ulong)(num_chr + 1);
  uVar13 = uVar8 * 8;
  if (num_chr < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar13);
  if (-1 < num_chr) {
    uVar15 = (ulong)(m + 1);
    uVar13 = uVar15 * 8;
    if (m < -1) {
      uVar13 = 0xffffffffffffffff;
    }
    lVar18 = uVar15 - 1;
    auVar22._8_4_ = (int)lVar18;
    auVar22._0_8_ = lVar18;
    auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar14 = 0;
    local_58 = auVar22 ^ _DAT_00109030;
    do {
      pvVar10 = operator_new__(uVar13);
      auVar22 = _DAT_00109030;
      *(void **)((long)pvVar9 + uVar14 * 8) = pvVar10;
      if (-1 < m) {
        uVar11 = 0;
        auVar20 = _DAT_00109020;
        do {
          bVar5 = (int)local_58._0_4_ < SUB164(auVar20 ^ auVar22,0);
          iVar21 = SUB164(auVar20 ^ auVar22,4);
          if ((bool)(~((int)local_58._4_4_ < iVar21 || iVar21 == local_58._4_4_ && bVar5) & 1)) {
            *(undefined8 *)((long)pvVar10 + uVar11) = 0xbff0000000000000;
          }
          if ((int)local_58._4_4_ >= iVar21 && (iVar21 != local_58._4_4_ || !bVar5)) {
            *(undefined8 *)((long)pvVar10 + uVar11 + 8) = 0xbff0000000000000;
          }
          lVar18 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 2;
          auVar20._8_8_ = lVar18 + 2;
          uVar11 = uVar11 + 0x10;
        } while ((uVar15 * 8 + 8 & 0xfffffffffffffff0) != uVar11);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar8);
    if (num_chr != 0) {
      uVar13 = 1;
      do {
        if (-1 < m) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_58._8_8_;
          local_58 = auVar6 << 0x40;
          uVar14 = 0;
          do {
            if (uVar14 == 0) {
              pdVar2 = *(double **)((long)pvVar9 + uVar13 * 8);
              *pdVar2 = 0.0;
              dVar19 = 0.0;
              uVar11 = 0;
              bVar5 = false;
              do {
                pdVar3 = NM[uVar11 + 1];
                dVar19 = dVar19 + *pdVar3;
                *pdVar2 = dVar19;
                dVar1 = *pdVar3;
                bVar7 = true;
                if (dVar1 != -1.0) {
                  bVar7 = bVar5;
                }
                if (NAN(dVar1)) {
                  bVar7 = bVar5;
                }
                uVar11 = uVar11 + 1;
                bVar5 = bVar7;
              } while (uVar13 != uVar11);
              if (bVar7) {
                *pdVar2 = -1.0;
              }
            }
            else if (uVar13 == 1) {
              *(double *)(*(long *)((long)pvVar9 + 8) + uVar14 * 8) = NM[1][uVar14];
            }
            else if (-1 < m_chr[uVar13]) {
              lVar12 = -1;
              lVar18 = local_58._0_8_;
              do {
                dVar19 = NM[uVar13][lVar12 + 1];
                if ((dVar19 != -1.0) || (NAN(dVar19))) {
                  dVar1 = *(double *)(*(long *)((long)pvVar9 + uVar13 * 8 + -8) + lVar18);
                  if ((dVar1 == -1.0) && (!NAN(dVar1))) goto LAB_001056f9;
                  dVar19 = dVar19 + dVar1;
                }
                else {
LAB_001056f9:
                  dVar19 = -1.0;
                }
                lVar17 = *(long *)((long)pvVar9 + uVar13 * 8);
                dVar19 = logsum(*(double *)(lVar17 + uVar14 * 8),dVar19);
                *(double *)(lVar17 + uVar14 * 8) = dVar19;
                iVar21 = m_chr[uVar13];
                if ((int)uVar14 <= m_chr[uVar13]) {
                  iVar21 = (int)uVar14;
                }
                lVar12 = lVar12 + 1;
                lVar18 = lVar18 + -8;
              } while (lVar12 < iVar21);
            }
            uVar14 = uVar14 + 1;
            local_58._0_8_ = local_58._0_8_ + 8;
          } while (uVar14 != uVar15);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar8);
    }
  }
  lVar18 = (long)num_chr;
  if (m < 0) {
    uVar13 = (ulong)(m + 1);
    local_78 = -1.0;
  }
  else {
    uVar13 = (ulong)(m + 1);
    lVar12 = *(long *)((long)pvVar9 + lVar18 * 8);
    local_78 = -1.0;
    uVar15 = 0;
    do {
      local_78 = logsum(local_78,*(double *)(lVar12 + uVar15 * 8));
      uVar15 = uVar15 + 1;
    } while (uVar13 != uVar15);
  }
  uVar15 = 0xffffffffffffffff;
  if (-2 < m) {
    uVar15 = uVar13 * 8;
  }
  pvVar10 = operator_new__(uVar15);
  if (-1 < m) {
    uVar15 = (ulong)(uint)m;
    lVar12 = uVar15 * 8 + 8;
    lVar17 = 0;
    do {
      lVar16 = lVar17 + -1;
      if (lVar17 == 0) {
        *(undefined8 *)((long)pvVar10 + uVar15 * 8) =
             *(undefined8 *)(*(long *)((long)pvVar9 + lVar18 * 8) + uVar15 * 8);
      }
      else {
        dVar19 = logsum(*(double *)((long)pvVar10 + lVar17 * 8 + lVar12),
                        *(double *)(*(long *)((long)pvVar9 + lVar18 * 8) + uVar15 * 8 + lVar17 * 8))
        ;
        *(double *)((long)pvVar10 + lVar16 * 8 + lVar12) = dVar19;
      }
      lVar17 = lVar16;
    } while (uVar13 + lVar16 != 0);
    if (-1 < m) {
      uVar15 = 0;
      do {
        dVar19 = exp(*(double *)((long)pvVar10 + uVar15 * 8) - local_78);
        p_value_g[uVar15] = dVar19;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
  }
  if (-1 < num_chr) {
    uVar13 = 0;
    do {
      pvVar4 = *(void **)((long)pvVar9 + uVar13 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      uVar13 = uVar13 + 1;
    } while (uVar8 != uVar13);
  }
  operator_delete__(pvVar9);
  operator_delete__(pvVar10);
  return;
}

Assistant:

void combine_chr(double* p_value_g, int m, int num_chr, int* m_chr, double** NM)
{
    double** M;
    M = new double* [num_chr+1];
    for(int q=0; q<=num_chr; q++)
    {
        M[q] = new double [m+1];
        for(int k=0; k<=m; k++)
            M[q][k] = -1;
    }
    for(int q=1; q<=num_chr; q++)
    {
        for(int k=0; k<=m; k++)
        {
            if (k==0)
            {
                M[q][0] = 0;
                int flag = 0;
                for(int j=1; j<=q; j++){
                    M[q][0] += NM[j][0];
                    if (NM[j][0]==-1)
                        flag = 1;
                }
                if (flag==1)
                    M[q][0] = -1;
            }
            else if (q==1)
                M[1][k] = NM[1][k]; //could lower max_m_chr by taking care of this
            else
            {
                double temp = -1;
                for(int i=0; i<=min(k,m_chr[q]); i++)
                {
                    temp = M[q-1][k-i]+NM[q][i];
                    if (NM[q][i]==-1 || M[q-1][k-i]==-1)
                        temp = -1;
                    M[q][k] = logsum(M[q][k], temp);
                }
            }
        }
    }

    double Sum1 = -1;
    for(int k=0; k<=m; k++) {
        Sum1 = logsum(Sum1, M[num_chr][k]);
    }

    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++) {
        if (k==0) {
            CumSum[m] = M[num_chr][m];
        }
        else CumSum[m-k] = logsum(CumSum[m-k+1], M[num_chr][m-k]);
    }

    for(int k=0; k<=m; k++) {
        p_value_g[k] = exp(CumSum[k] - Sum1);
    }

    for(int i=0; i<=num_chr; i++)
    {
        delete [] M[i];
    }
    delete [] M;
    delete [] CumSum;
    return;
}